

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyManager.cpp
# Opt level: O3

void __thiscall Node::FindAdd(Node *this,char *part,bool *done,Node **newNode)

{
  char *pcVar1;
  char cVar2;
  Node *pNVar3;
  char *part1;
  char cVar4;
  char *part_00;
  char *pcVar5;
  Node **ppNVar6;
  
  if (*done == false) {
    part1 = this->uri;
    cVar2 = *part1;
    cVar4 = *part;
    if (cVar2 == cVar4) {
      if (cVar4 != '\0' && cVar2 != '\0') {
        part_00 = part + 1;
        pcVar1 = part1;
        do {
          pcVar5 = pcVar1 + 1;
          if (cVar2 != cVar4) {
            part = part_00 + -1;
            part1 = pcVar1;
            break;
          }
          cVar2 = *pcVar5;
          cVar4 = *part_00;
          if (cVar2 == '\0') {
            if ((cVar4 != '\0') &&
               (ppNVar6 = this->next, part = part_00, part1 = pcVar5, ppNVar6 != (Node **)0x0)) {
              pNVar3 = *ppNVar6;
              while (pNVar3 != (Node *)0x0) {
                ppNVar6 = ppNVar6 + 1;
                FindAdd(pNVar3,part_00,done,newNode);
                if (*done != false) {
                  return;
                }
                pNVar3 = *ppNVar6;
              }
            }
            break;
          }
          part_00 = part_00 + 1;
          pcVar1 = pcVar5;
        } while (cVar4 != '\0');
      }
      pNVar3 = Add(this,part1,part);
      *newNode = pNVar3;
      *done = true;
    }
  }
  return;
}

Assistant:

void Node::FindAdd(const char* part, bool *done, class Node ** newNode) {
	if (*done)
		return;
	class Node **nx;
	char *tmp1;
	const char *tmp2;

	tmp1 = uri;
	tmp2 = part;


	//first character is different, we are not interested by this node
	if (*tmp1 != *tmp2)
		return;


//
//	if ( strcmp(tmp1,tmp2) == 0) {
//		*newNode = Add(tmp1, tmp2);
//		*done = true;
//		return;
//	}


//	cerr << "----->1 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
	while (*tmp1 && *tmp2) {
//		cerr << "----->1aaa tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		if (*tmp1 == *tmp2) {
			tmp1++;
			tmp2++;
		} else {
//			cerr << "----->2 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl ;
			*newNode = Add(tmp1, tmp2);
			*done = true;
//			if (*newNode == NULL) {cerr << "-----> 1 uposss" << done << endl ; }
			return;
		}
	}

//	cerr << "part: " << part << endl;

	if (*tmp2 != '\0') {
//		cerr << "----->1 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		if (next) {
//			cerr << "----->2 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
			nx = next;
			while (*nx != NULL) {
				(*nx)->FindAdd(tmp2, done, newNode);
				if (*done) {
					return;
				}
				nx++;
			}
		}

//		cerr << "----->1 tmp3 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		*newNode = Add(tmp1, tmp2);
		//	if (*newNode == NULL) {cerr << "-----> 3 uposss" << done << endl ; }
		*done = true;
	} else {
//		cerr << "----->3 tmp1 & tmp2: " << uri  << "\t" << part << endl ;
		//if (leaf == NULL) {
//			cerr << "1" << endl;
		*newNode = Add(uri, part);
		*done = true;
//		} else {
//			cerr << "2" << endl;
//			*newNode = this;
//			*done = true;
//		}
	}

}